

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

void iterate_md5_digest(MD5 *md5,Digest *digest,int iterations,int key_len)

{
  unsigned_long len;
  undefined4 in_register_0000000c;
  size_t extraout_RDX;
  size_t n;
  size_t extraout_RDX_00;
  Digest *d;
  int iVar1;
  bool bVar2;
  MD5 m;
  int local_44;
  MD5 local_40;
  
  d = digest;
  local_44 = key_len;
  MD5::digest(md5,*digest);
  iVar1 = 0;
  if (0 < iterations) {
    iVar1 = iterations;
  }
  n = extraout_RDX;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    MD5::MD5(&local_40,*d,n,(uchar *)CONCAT44(in_register_0000000c,key_len));
    len = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_44);
    MD5::encodeDataIncrementally(&local_40,(char *)digest,len);
    d = digest;
    MD5::digest(&local_40,*digest);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    n = extraout_RDX_00;
  }
  return;
}

Assistant:

static void
iterate_md5_digest(MD5& md5, MD5::Digest& digest, int iterations, int key_len)
{
    md5.digest(digest);

    for (int i = 0; i < iterations; ++i) {
        MD5 m;
        m.encodeDataIncrementally(reinterpret_cast<char*>(digest), QIntC::to_size(key_len));
        m.digest(digest);
    }
}